

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinusoidal_linear_chirp_source.cc
# Opt level: O2

void __thiscall
webrtc::SinusoidalLinearChirpSource::Run
          (SinusoidalLinearChirpSource *this,size_t frames,float *destination)

{
  size_t position;
  size_t i;
  size_t sVar1;
  double dVar2;
  undefined1 auVar3 [16];
  
  sVar1 = 0;
  do {
    if (frames == sVar1) {
      return;
    }
    position = this->current_index_;
    dVar2 = Frequency(this,position);
    if ((double)this->sample_rate_ * 0.5 < dVar2) {
LAB_00150472:
      destination[sVar1] = 0.0;
    }
    else {
      auVar3._8_4_ = (int)(position >> 0x20);
      auVar3._0_8_ = position;
      auVar3._12_4_ = 0x45300000;
      dVar2 = (auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)position) - 4503599627370496.0);
      if (dVar2 < this->delay_samples_) goto LAB_00150472;
      dVar2 = (dVar2 - this->delay_samples_) / (double)this->sample_rate_;
      dVar2 = sin((dVar2 * 5.0 + this->k_ * 0.5 * dVar2 * dVar2) * 6.283185307179586);
      destination[sVar1] = (float)dVar2;
      position = this->current_index_;
    }
    sVar1 = sVar1 + 1;
    this->current_index_ = position + 1;
  } while( true );
}

Assistant:

void SinusoidalLinearChirpSource::Run(size_t frames, float* destination) {
  for (size_t i = 0; i < frames; ++i, ++current_index_) {
    // Filter out frequencies higher than Nyquist.
    if (Frequency(current_index_) > 0.5 * sample_rate_) {
      destination[i] = 0;
    } else {
      // Calculate time in seconds.
      if (current_index_ < delay_samples_) {
        destination[i] = 0;
      } else {
        // Sinusoidal linear chirp.
        double t = (current_index_ - delay_samples_) / sample_rate_;
        destination[i] =
            sin(2 * M_PI * (kMinFrequency * t + (k_ / 2) * t * t));
      }
    }
  }
}